

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_GetPatternForSkeleton
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  char16 *pcVar2;
  bool bVar3;
  UBool UVar4;
  int iVar5;
  CallFlags e;
  ScriptContext *pSVar6;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar7;
  LPCSTR pCVar8;
  undefined4 extraout_var;
  void **object;
  Recycler *pRVar9;
  undefined8 uVar10;
  undefined4 extraout_var_00;
  JavascriptString *pJVar11;
  anon_class_16_2_aae633bf executor;
  int in_stack_fffffffffffffdb0;
  charcount_t local_1e4;
  char16 *pcStack_1e0;
  int formattedLen;
  char16 *formatted;
  ScopedICUObject<void_**,_&udatpg_close_70> local_1c8;
  ScopedUDateTimePatternGenerator dtpg;
  undefined1 local_1b8 [4];
  int baseLocaleIDLength;
  char baseLocaleID [157];
  char localeID [157];
  UErrorCode local_6c;
  ScopedUDateTimePatternGenerator SStack_68;
  UErrorCode status;
  JavascriptString *skeleton;
  JavascriptString *langtag;
  ScriptContext *scriptContext;
  CallInfo CStack_48;
  uint argCount;
  undefined1 local_40 [8];
  Arguments args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  pSVar6 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar6);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar6,(PVOID)0x0);
  iVar5 = _count_args(callInfo);
  values = _get_va(&stack0x00000000,iVar5);
  args.Values = (Type)callInfo;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xaf3,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  CStack_48 = callInfo;
  Arguments::Arguments((Arguments *)local_40,callInfo,values);
  e = Js::operator&(callInfo._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xaf3,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  scriptContext._4_4_ = local_40._0_4_ & 0xffffff;
  langtag = (JavascriptString *)RecyclableObject::GetScriptContext(function);
  if (scriptContext._4_4_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xaf3,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((((local_40._0_4_ & 0xffffff) != 3) ||
      (bVar3 = VarIs<Js::JavascriptString>(*(Var *)((long)args.Info + 8)), !bVar3)) ||
     (bVar3 = VarIs<Js::JavascriptString>(*(Var *)((long)args.Info + 0x10)), !bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xaf4,
                                "((args.Info.Count == 3 && VarIs<JavascriptString>(args.Values[1]) && VarIs<JavascriptString>(args.Values[2])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  skeleton = UnsafeVarTo<Js::JavascriptString>(*(Var *)((long)args.Info + 8));
  SStack_68.object = (void **)UnsafeVarTo<Js::JavascriptString>(*(Var *)((long)args.Info + 0x10));
  local_6c = U_ZERO_ERROR;
  memset(baseLocaleID + 0x98,0,0x9d);
  LangtagToLocaleID<157ul>(skeleton,(char (*) [157])(baseLocaleID + 0x98));
  memset(local_1b8,0,0x9d);
  dtpg.object._4_4_ = uloc_getBaseName_70(baseLocaleID + 0x98,local_1b8,0x9d,&local_6c);
  if (local_6c == U_MEMORY_ALLOCATION_ERROR) {
    Throw::OutOfMemory();
  }
  UVar4 = U_FAILURE(local_6c);
  if ((UVar4 == '\0') && (local_6c != U_STRING_NOT_TERMINATED_WARNING)) {
    if (((dtpg.object._4_4_ < 1) || (0x9c < dtpg.object._4_4_)) &&
       ((dtpg.object._4_4_ < 1 || (0x9c < dtpg.object._4_4_)))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xb08,"(baseLocaleIDLength > 0 && baseLocaleIDLength < 157)",
                                  "baseLocaleIDLength > 0 && baseLocaleIDLength < 157");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    pCVar8 = (LPCSTR)u_errorName_70(local_6c);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb08,"(false)",pCVar8);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  iVar5 = (*(skeleton->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])();
  Output::Trace(IntlPhase,
                L"%S(): Converted input langtag \'%s\' to base locale ID \'%S\' for pattern generation\n"
                ,"EntryIntl_GetPatternForSkeleton",CONCAT44(extraout_var,iVar5),local_1b8);
  object = (void **)udatpg_open_70(local_1b8,&local_6c);
  PlatformAgnostic::ICUHelpers::ScopedICUObject<void_**,_&udatpg_close_70>::ScopedICUObject
            (&local_1c8,object);
  if (local_6c != U_MEMORY_ALLOCATION_ERROR) {
    UVar4 = U_FAILURE(local_6c);
    if ((UVar4 != '\0') || (local_6c == U_STRING_NOT_TERMINATED_WARNING)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      pCVar8 = (LPCSTR)u_errorName_70(local_6c);
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xb0d,"(false)",pCVar8);
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pcStack_1e0 = (char16 *)0x0;
    local_1e4 = 0;
    pRVar9 = ScriptContext::GetRecycler((ScriptContext *)langtag);
    executor.skeleton = (JavascriptString **)pRVar9;
    executor.dtpg = &stack0xffffffffffffff98;
    EnsureBuffer<Js::IntlEngineInterfaceExtensionObject::EntryIntl_GetPatternForSkeleton(Js::RecyclableObject*,Js::CallInfo,___)::__0>
              ((Js *)&local_1c8,executor,(Recycler *)&stack0xfffffffffffffe20,(char16 **)&local_1e4,
               (int *)&DAT_00000001,true,in_stack_fffffffffffffdb0);
    pcVar2 = pcStack_1e0;
    uVar10 = (**(code **)((long)*SStack_68.object + 0x328))();
    iVar5 = (*(skeleton->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
    Output::Trace(IntlPhase,
                  L"%S(): Best pattern \'%s\' will be used for skeleton \'%s\' and langtag \'%s\'\n"
                  ,"EntryIntl_GetPatternForSkeleton",pcVar2,uVar10,CONCAT44(extraout_var_00,iVar5));
    pJVar11 = JavascriptString::NewWithBuffer(pcStack_1e0,local_1e4,(ScriptContext *)langtag);
    PlatformAgnostic::ICUHelpers::ScopedICUObject<void_**,_&udatpg_close_70>::~ScopedICUObject
              (&local_1c8);
    return pJVar11;
  }
  Throw::OutOfMemory();
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_GetPatternForSkeleton(RecyclableObject *function, CallInfo callInfo, ...)
    {
#ifdef INTL_ICU
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(args.Info.Count == 3 && VarIs<JavascriptString>(args.Values[1]) && VarIs<JavascriptString>(args.Values[2]));

        JavascriptString *langtag = UnsafeVarTo<JavascriptString>(args.Values[1]);
        JavascriptString *skeleton = UnsafeVarTo<JavascriptString>(args.Values[2]);
        UErrorCode status = U_ZERO_ERROR;
        char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
        LangtagToLocaleID(langtag, localeID);

        // See https://github.com/tc39/ecma402/issues/225
        // When picking a format, we should be using the locale data of the basename of the resolved locale,
        // compared to when we actually format the date using the format string, where we use the full locale including extensions
        //
        // ECMA 402 #sec-initializedatetimeformat
        // 10: Let localeData be %DateTimeFormat%.[[LocaleData]].
        // 11: Let r be ResolveLocale( %DateTimeFormat%.[[AvailableLocales]], requestedLocales, opt, %DateTimeFormat%.[[RelevantExtensionKeys]], localeData).
        // 16: Let dataLocale be r.[[dataLocale]].
        // 23: Let dataLocaleData be localeData.[[<dataLocale>]].
        // 24: Let formats be dataLocaleData.[[formats]].
        char baseLocaleID[ULOC_FULLNAME_CAPACITY] = { 0 };
        int baseLocaleIDLength = uloc_getBaseName(localeID, baseLocaleID, _countof(baseLocaleID), &status);
        ICU_ASSERT(status, baseLocaleIDLength > 0 && baseLocaleIDLength < ULOC_FULLNAME_CAPACITY);

        INTL_TRACE("Converted input langtag '%s' to base locale ID '%S' for pattern generation", langtag->GetSz(), baseLocaleID);

        ScopedUDateTimePatternGenerator dtpg(udatpg_open(baseLocaleID, &status));
        ICU_ASSERT(status, true);

        char16 *formatted = nullptr;
        int formattedLen = 0;

        // OS#17513493 (OSS-Fuzz 7950): It is possible for the skeleton to be a zero-length string
        // because [[Get]] operations are performed on the options object twice, according to spec.
        // Follow-up spec discussion here: https://github.com/tc39/ecma402/issues/237.
        // We need to special-case this because calling udatpg_getBestPatternWithOptions on an empty skeleton
        // will produce an empty pattern, which causes an assert in EnsureBuffer by default.
        // As a result, we pass a final optional parameter to EnsureBuffer to say that zero-length results are OK.
        // TODO(jahorto): re-visit this workaround and the one in FormatDateTime upon resolution of the spec issue.
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return udatpg_getBestPatternWithOptions(
                dtpg,
                reinterpret_cast<const UChar *>(skeleton->GetSz()),
                skeleton->GetLength(),
                UDATPG_MATCH_ALL_FIELDS_LENGTH,
                buf,
                bufLen,
                status
            );
        }, scriptContext->GetRecycler(), &formatted, &formattedLen, /* allowZeroLengthStrings */ true);

        INTL_TRACE("Best pattern '%s' will be used for skeleton '%s' and langtag '%s'", formatted, skeleton->GetSz(), langtag->GetSz());

        return JavascriptString::NewWithBuffer(formatted, formattedLen, scriptContext);
#else
        AssertOrFailFastMsg(false, "GetPatternForSkeleton is not implemented outside of ICU");
        return nullptr;
#endif
    }